

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biginteger.cpp
# Opt level: O1

void __thiscall BigInteger::multiply(BigInteger *this,uint a)

{
  iterator __position;
  pointer puVar1;
  ulong in_RAX;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  undefined8 uStack_38;
  
  uVar4 = 0;
  uStack_38 = in_RAX;
  for (uVar3 = 0;
      (uVar4 != 0 ||
      (uVar3 < (ulong)((long)(this->digits).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish -
                       (long)(this->digits).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start >> 2))); uVar3 = uVar3 + 1) {
    __position._M_current =
         (this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if ((ulong)((long)__position._M_current -
                (long)(this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 2) <= uVar3) {
      uStack_38 = uStack_38 & 0xffffffff;
      if (__position._M_current ==
          (this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                  (&this->digits,__position,(uint *)((long)&uStack_38 + 4));
      }
      else {
        *__position._M_current = 0;
        (this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
    }
    puVar1 = (this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar2 = (ulong)puVar1[uVar3] * (ulong)a + uVar4;
    uVar4 = uVar2 / 1000000000;
    puVar1[uVar3] = (int)uVar2 + (int)uVar4 * -1000000000;
  }
  return;
}

Assistant:

void BigInteger::multiply(unsigned a) noexcept
{
    long long carry = 0;
    for(size_t i = 0; carry || i < digits.size(); i++)
    {
        if(i >= digits.size())
            digits.push_back(0);
        long long new_carry = (digits[i] * 1ll * a + carry) / BLOCK_MOD;
        digits[i] = (digits[i] * 1ll * a + carry) % BLOCK_MOD;
        carry = new_carry;
    }
}